

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmfont.c
# Opt level: O3

int each_character(ALLEGRO_FONT *f,ALLEGRO_COLOR color,ALLEGRO_USTR *text,float x,float y,
                  ALLEGRO_GLYPH *glyph,
                  _func_int_ALLEGRO_FONT_ptr_ALLEGRO_COLOR_int_float_float_ALLEGRO_GLYPH_ptr *cb)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ALLEGRO_COLOR AVar11;
  int pos;
  undefined4 local_64;
  void *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_48._8_4_ = in_XMM1_Dc;
  local_48._0_8_ = color._8_8_;
  local_48._12_4_ = in_XMM1_Dd;
  local_58._8_4_ = in_XMM0_Dc;
  local_58._0_8_ = color._0_8_;
  local_58._12_4_ = in_XMM0_Dd;
  local_60 = f->data;
  local_64 = 0;
  iVar4 = al_ustr_get_next(text);
  iVar10 = 0;
  if (iVar4 < 0) {
    return 0;
  }
  iVar6 = 0;
LAB_00106279:
  auVar3 = local_48;
  auVar2 = local_58;
  if (iVar6 != 0) {
    iVar7 = 0;
    for (piVar8 = *(int **)((long)local_60 + 0x10); iVar5 = 0, piVar8 != (int *)0x0;
        piVar8 = *(int **)(piVar8 + 4)) {
      iVar5 = *piVar8;
      if ((iVar5 <= iVar6) && (iVar6 < iVar5 + piVar8[1])) {
        lVar1 = *(long *)(*(long *)(piVar8 + 2) + (long)(iVar6 - iVar5) * 8);
        iVar5 = iVar7;
        if ((lVar1 != 0) && (0 < (long)*(int *)(lVar1 + 0x24))) {
          lVar9 = 0;
          goto LAB_001062cb;
        }
        break;
      }
    }
    goto LAB_001062e0;
  }
  goto LAB_001062e3;
  while (lVar9 = lVar9 + 0xc, (long)*(int *)(lVar1 + 0x24) * 0xc != lVar9) {
LAB_001062cb:
    if (*(int *)(*(long *)(lVar1 + 0x28) + 4 + lVar9) == iVar4) {
      iVar5 = *(int *)(*(long *)(lVar1 + 0x28) + 8 + lVar9);
      break;
    }
  }
LAB_001062e0:
  iVar10 = iVar10 + iVar5;
LAB_001062e3:
  AVar11.b = (float)local_48._0_4_;
  AVar11.a = (float)local_48._4_4_;
  AVar11.r = (float)local_58._0_4_;
  AVar11.g = (float)local_58._4_4_;
  local_58 = auVar2;
  local_48 = auVar3;
  iVar6 = (*cb)(f,AVar11,iVar4,(float)iVar10 + x,y,glyph);
  iVar10 = iVar10 + iVar6;
  iVar7 = al_ustr_get_next(text,&local_64);
  iVar6 = iVar4;
  iVar4 = iVar7;
  if (iVar7 < 0) {
    return iVar10;
  }
  goto LAB_00106279;
}

Assistant:

static int each_character(const ALLEGRO_FONT *f, ALLEGRO_COLOR color,
      const ALLEGRO_USTR *text, float x, float y, ALLEGRO_GLYPH *glyph,
      int (*cb)(const ALLEGRO_FONT *f, ALLEGRO_COLOR color, int ch,
      float x, float y, ALLEGRO_GLYPH *glyph)) {
   BMFONT_DATA *data = f->data;
   int pos = 0;
   int advance = 0;
   int prev = 0;
   while (true) {
      int c = al_ustr_get_next(text, &pos);
      if (c < 0) break;
      if (prev) {
         BMFONT_CHAR *pc = find_codepoint(data, prev);
         advance += get_kerning(pc, c);
      }
      advance += cb(f, color, c, x + advance, y, glyph);
      prev = c;
   }
   return advance;
}